

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from,CopyFn copy_fn)

{
  Arena *pAVar1;
  int iVar2;
  uint uVar3;
  void **ppvVar4;
  RepeatedPtrFieldBase *pRVar5;
  Rep *pRVar6;
  RepeatedPtrFieldBase *pRVar7;
  void *pvVar8;
  Nonnull<const_char_*> pcVar9;
  int iVar10;
  int iVar11;
  
  if (from == this) {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from,this,"&from != this");
  }
  else {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar9 == (Nonnull<const_char_*>)0x0) {
    iVar10 = from->current_size_ + this->current_size_;
    iVar2 = this->capacity_proxy_ + 1;
    iVar11 = iVar10 - iVar2;
    if (iVar11 == 0 || iVar10 < iVar2) {
      pRVar5 = this;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar6 = rep(this);
        pRVar5 = (RepeatedPtrFieldBase *)pRVar6->elements;
      }
      ppvVar4 = &pRVar5->tagged_rep_or_elem_ + this->current_size_;
    }
    else {
      ppvVar4 = InternalExtend(this,iVar11);
    }
    pRVar5 = from;
    if (((ulong)from->tagged_rep_or_elem_ & 1) != 0) {
      pRVar6 = rep(from);
      pRVar5 = (RepeatedPtrFieldBase *)pRVar6->elements;
    }
    iVar2 = from->current_size_;
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar6 = rep(this);
      uVar3 = pRVar6->allocated_size;
    }
    pRVar7 = pRVar5;
    if (this->current_size_ < (int)uVar3) {
      iVar11 = MergeIntoClearedMessages(this,from);
      ppvVar4 = ppvVar4 + iVar11;
      pRVar7 = (RepeatedPtrFieldBase *)(&pRVar5->tagged_rep_or_elem_ + iVar11);
    }
    pAVar1 = this->arena_;
    if (0 < from->current_size_) {
      for (; pRVar7 < &((RepeatedPtrFieldBase *)(&pRVar5->tagged_rep_or_elem_ + iVar2))[-1].arena_;
          pRVar7 = (RepeatedPtrFieldBase *)&pRVar7->current_size_) {
        pvVar8 = (*copy_fn)(pAVar1,pRVar7->tagged_rep_or_elem_);
        *ppvVar4 = pvVar8;
        ppvVar4 = ppvVar4 + 1;
      }
    }
    for (; pRVar7 < (RepeatedPtrFieldBase *)(&pRVar5->tagged_rep_or_elem_ + iVar2);
        pRVar7 = (RepeatedPtrFieldBase *)&pRVar7->current_size_) {
      pvVar8 = (*copy_fn)(pAVar1,pRVar7->tagged_rep_or_elem_);
      *ppvVar4 = pvVar8;
      ppvVar4 = ppvVar4 + 1;
    }
    this->current_size_ = iVar10;
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar6 = rep(this);
      uVar3 = pRVar6->allocated_size;
    }
    if ((int)uVar3 < iVar10) {
      pRVar6 = rep(this);
      pRVar6->allocated_size = iVar10;
    }
    return;
  }
  MergeFromConcreteMessage();
}

Assistant:

void RepeatedPtrFieldBase::MergeFromConcreteMessage(
    const RepeatedPtrFieldBase& from, CopyFn copy_fn) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  int new_size = current_size_ + from.current_size_;
  void** dst = InternalReserve(new_size);
  const void* const* src = from.elements();
  auto end = src + from.current_size_;
  constexpr ptrdiff_t kPrefetchstride = 1;
  if (ABSL_PREDICT_FALSE(ClearedCount() > 0)) {
    int recycled = MergeIntoClearedMessages(from);
    dst += recycled;
    src += recycled;
  }
  Arena* arena = GetArena();
  if (from.current_size_ >= kPrefetchstride) {
    auto prefetch_end = end - kPrefetchstride;
    for (; src < prefetch_end; ++src, ++dst) {
      auto next = src + kPrefetchstride;
      absl::PrefetchToLocalCache(*next);
      *dst = copy_fn(arena, *src);
    }
  }
  for (; src < end; ++src, ++dst) {
    *dst = copy_fn(arena, *src);
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}